

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

uint32 __thiscall
Clasp::Asp::LogicProgram::findBody
          (LogicProgram *this,uint32 hash,Body_t type,uint32 size,weight_t bound,WeightLit_t *sum)

{
  uint uVar1;
  uint uVar2;
  PrgBody *rhs;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  LogicProgram *this_00;
  LogicProgram *pLVar9;
  uint uVar10;
  IndexIter it;
  bool bVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  pVar12;
  uint32 local_70;
  _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> local_50;
  uint32 local_44;
  WeightLitSpan local_40;
  
  local_44 = hash;
  pVar12 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                          *)this->index_,&local_44);
  if (type.val_ == Normal) {
    bound = size;
  }
  if ((__node_type *)
      pVar12.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur != pVar12.second.
                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
                .super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>) {
    uVar8 = (ulong)size;
    lVar4 = 0x3f;
    if (uVar8 != 0) {
      for (; size >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    bVar6 = false;
    do {
      local_50 = pVar12.second.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                 _M_cur;
      rhs = (this->bodies_).ebo_.buf
            [*(uint *)((long)pVar12.first.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                      + 0xc)];
      bVar7 = checkBody(this,rhs,type,size,bound);
      bVar5 = false;
      if (bVar7) {
        uVar1 = *(uint *)&rhs->field_0x8;
        this_00 = (LogicProgram *)((ulong)uVar1 & 0x1ffffff);
        if ((uVar1 & 0x1ffffff) != 0) {
          this_00 = (LogicProgram *)((long)this_00 * 4 - 4);
          pLVar9 = (LogicProgram *)0x0;
          do {
            uVar2 = *(uint *)(&(&rhs[1].super_PrgNode)[(uVar1 & 0x18000000) != 0].field_0x0 +
                             (long)&(pLVar9->super_ProgramBuilder)._vptr_ProgramBuilder);
            uVar10 = uVar2 >> 2;
            if (uVar10 < (this->atomState_).state_.ebo_.size) {
              bVar7 = ((this->atomState_).state_.ebo_.buf[uVar10] & 2U - ((uVar2 & 2) == 0)) != 0;
            }
            else {
              bVar7 = false;
            }
          } while ((bVar7) &&
                  (bVar11 = this_00 != pLVar9,
                  pLVar9 = (LogicProgram *)
                           ((long)&(pLVar9->super_ProgramBuilder)._vptr_ProgramBuilder + 4), bVar11)
                  );
          if (!bVar7) goto LAB_00142899;
        }
        if ((uVar1 & 0x18000000) == 0x8000000) {
          bVar5 = false;
          if (sum != (WeightLit_t *)0x0) {
            bVar7 = bVar6;
            if (!bVar6) {
              bVar7 = true;
            }
            bVar11 = !bVar6;
            bVar6 = bVar7;
            if (size != 0 && bVar11) {
              std::__introsort_loop<Potassco::WeightLit_t*,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (sum,sum + uVar8,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
              this_00 = (LogicProgram *)sum;
              std::__final_insertion_sort<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_less_iter>
                        (sum,sum + uVar8);
              bVar6 = true;
            }
            local_40.first = sum;
            local_40.size = uVar8;
            bVar7 = equalLits(this_00,rhs,&local_40);
            if (bVar7) goto LAB_00142885;
          }
        }
        else {
LAB_00142885:
          local_70 = *(uint *)&(rhs->super_PrgNode).field_0x4 & 0xfffffff;
          bVar5 = true;
        }
      }
LAB_00142899:
      if (bVar5) {
        return local_70;
      }
      _Var3._M_cur = *pVar12.first.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>;
      pVar12.second.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur = local_50.
               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
      pVar12.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var3._M_cur
      ;
    } while ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var3._M_cur
             != local_50.
                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
            );
  }
  return 0x40000000;
}

Assistant:

uint32 LogicProgram::findBody(uint32 hash, Body_t type, uint32 size, weight_t bound, Potassco::WeightLit_t* sum) {
	IndexRange bodies = index_->body.equal_range(hash);
	bool sorted = false;
	if (type == Body_t::Normal) { bound = static_cast<weight_t>(size); }
	for (IndexIter it = bodies.first; it != bodies.second; ++it) {
		const PrgBody& b = *getBody(it->second);
		if (!checkBody(b, type, size, bound) || !atomState_.inBody(b.goals_begin(), b.goals_end())) {
			continue;
		}
		else if (!b.hasWeights()) {
			return b.id();
		}
		else if (sum) {
			if (!sorted) {
				std::sort(sum, sum + size);
				sorted = true;
			}
			if (equalLits(b, Potassco::toSpan(sum, size))) { return b.id(); }
		}
	}
	return varMax;
}